

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O0

long __thiscall
Alice::ObliviousTranslateSingleAddress
          (Alice *this,long addr,
          vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *Perm)

{
  long arg1;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *arg1_00;
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  double dVar4;
  allocator local_59;
  string local_58 [36];
  int local_34;
  long lStack_30;
  int i;
  long beta;
  double result;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *Perm_local;
  long addr_local;
  Alice *this_local;
  
  beta = 0;
  lStack_30 = 0;
  local_34 = 0;
  result = (double)Perm;
  Perm_local = (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)addr;
  addr_local = (long)this;
  while( true ) {
    uVar1 = (ulong)local_34;
    sVar2 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::size(Perm);
    if (sVar2 <= uVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"==",&local_59);
    arg1_00 = Perm_local;
    pvVar3 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::operator[]
                       (Perm,(long)local_34);
    lStack_30 = ObliviousComparison(this,(string *)local_58,(long)arg1_00,pvVar3->first);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    arg1 = lStack_30;
    pvVar3 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::operator[]
                       (Perm,(long)local_34);
    dVar4 = ObliviousMultiplication(this,arg1,pvVar3->second);
    beta = (long)(dVar4 + (double)beta);
    local_34 = local_34 + 1;
  }
  return (long)(double)beta;
}

Assistant:

long Alice::ObliviousTranslateSingleAddress(long addr, std::vector<std::pair<long,long>> Perm)
{
   double result = 0;
   long beta = 0;
   for(int i=0; i < Perm.size(); i++)
   {
       beta = ObliviousComparison("==", addr, Perm[i].first);
       result += ObliviousMultiplication(beta, Perm[i].second);
   } 
   return result;
}